

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteCompileRule
          (cmNinjaTargetGenerator *this,string *lang,string *config,WithScanning withScanning)

{
  cmMakefile *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  size_t sVar6;
  string_view lang_00;
  string_view lang_01;
  string_view srcFile;
  string_view srcFile_00;
  string_view ddiFile;
  string_view ddiFile_00;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> srcOrigFile;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> srcOrigFile_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanCmds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanCmds_00;
  size_type sVar7;
  size_type this_00;
  _Alloc_hider _Var8;
  size_type sVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  TargetType targetType;
  int iVar13;
  string *psVar14;
  string *psVar15;
  cmGlobalNinjaGenerator *pcVar16;
  cmValue cVar17;
  cmValue cVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_1;
  _Alloc_hider _Var19;
  pointer b;
  cmNinjaTargetGenerator *this_01;
  char *pcVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  long lVar21;
  string_view source;
  string_view source_00;
  string_view cmakeCmd_00;
  string_view cmakeCmd_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string_view tdi_00;
  string_view tdi_01;
  pointer pbVar22;
  undefined7 in_stack_fffffffffffffa18;
  string cmdVar;
  char local_5b1;
  string cudaCompileMode;
  allocator<char> local_572;
  allocator<char> local_571;
  string cldeps;
  cmRulePlaceholderExpander *local_550;
  string depfileFlags;
  string defName;
  cmList compileCmds;
  string local_4e0;
  string cmakeCmd;
  string flags;
  string responseFlag;
  cmNinjaRule rule;
  string tdi;
  string launcher;
  string modmapFormat;
  string val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208;
  uint7 uStack_207;
  string modmapFormatVar;
  string local_1e0;
  string local_1c0;
  RuleVariables local_1a0;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_48;
  undefined8 local_38;
  
  memset(&local_1a0.TargetVersionMajor,0,0x138);
  psVar14 = cmGeneratorTarget::GetName_abi_cxx11_
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_1a0.CMTargetName = (psVar14->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  this_01 = (cmNinjaTargetGenerator *)(ulong)targetType;
  psVar14 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  local_1a0.CMTargetType = (psVar14->_M_dataplus)._M_p;
  local_1a0.Language = (lang->_M_dataplus)._M_p;
  local_1a0.Source = "$in";
  local_1a0.Object = "$out";
  local_1a0.Defines = "$DEFINES";
  local_1a0.Includes = "$INCLUDES";
  local_1a0.TargetPDB = "$TARGET_PDB";
  local_1a0.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_1a0.ObjectDir = "$OBJECT_DIR";
  local_1a0.ObjectFileDir = "$OBJECT_FILE_DIR";
  local_1a0.CudaCompileMode = "$CUDA_COMPILE_MODE";
  local_1a0.ISPCHeader = "$ISPC_HEADER_FILE";
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cVar10 = NeedExplicitPreprocessing(this_01,lang);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags,"$FLAGS",(allocator<char> *)&rule);
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  bVar11 = std::operator!=(lang,"RC");
  if ((bVar11) && (bVar11 = ForceResponseFile(this), bVar11)) {
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[20]>
              (&rule.Name,(char (*) [7])0x695e73,lang,(char (*) [20])"_RESPONSE_FILE_FLAG");
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,&rule.Name);
    std::__cxx11::string::_M_assign((string *)&responseFlag);
    if ((responseFlag._M_string_length == 0) && (bVar11 = std::operator!=(lang,"CUDA"), bVar11)) {
      std::__cxx11::string::assign((char *)&responseFlag);
    }
    std::__cxx11::string::~string((string *)&rule);
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
            (&modmapFormatVar,(char (*) [7])0x695e73,lang,(char (*) [19])"_MODULE_MAP_FORMAT");
  psVar14 = cmMakefile::GetSafeDefinition
                      ((this->super_cmCommonTargetGenerator).Makefile,&modmapFormatVar);
  std::__cxx11::string::string((string *)&modmapFormat,(string *)psVar14);
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_550);
  pcVar2 = this->LocalGenerator;
  GetTargetDependInfoPath(&rule.Name,this,lang,config);
  psVar14 = ConvertToNinjaPath(this,&rule.Name);
  source._M_str = (psVar14->_M_dataplus)._M_p;
  source._M_len = psVar14->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&tdi,(cmOutputConverter *)pcVar2,source,SHELL,false);
  std::__cxx11::string::~string((string *)&rule);
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rule,"RULE_LAUNCH_COMPILE",(allocator<char> *)&cmakeCmd);
  cmLocalGenerator::GetRuleLauncher(&val,(cmLocalGenerator *)pcVar2,pcVar3,&rule.Name,config);
  std::__cxx11::string::~string((string *)&rule);
  if (val._M_string_length != 0) {
    cmakeCmd._M_dataplus._M_p._0_1_ = 0x20;
    cmStrCat<std::__cxx11::string&,char>(&rule.Name,&val,(char *)&cmakeCmd);
    std::__cxx11::string::operator=((string *)&launcher,(string *)&rule);
    std::__cxx11::string::~string((string *)&rule);
  }
  pcVar2 = this->LocalGenerator;
  psVar14 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  pcVar20 = (char *)0x0;
  source_00._M_str = (psVar14->_M_dataplus)._M_p;
  source_00._M_len = psVar14->_M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&cmakeCmd,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
  if (withScanning == Yes) {
    pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
              (&rule.Name,(char (*) [7])0x695e73,lang,(char (*) [24])"_SCANDEP_DEPFILE_FORMAT");
    psVar14 = cmMakefile::GetSafeDefinition(pcVar4,&rule.Name);
    std::__cxx11::string::~string((string *)&rule);
    cmdVar.field_2._M_allocated_capacity = 0;
    cmdVar._M_dataplus._M_p = (pointer)0x0;
    cmdVar._M_string_length = 0;
    cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
    cldeps._M_string_length = 0;
    cudaCompileMode._M_dataplus._M_p = (pointer)&cudaCompileMode.field_2;
    cudaCompileMode._M_string_length = 0;
    cldeps.field_2._M_local_buf[0] = '\0';
    cudaCompileMode.field_2._M_local_buf[0] = '\0';
    if (cVar10 == '\0') {
      LanguageScanRule(&rule.Name,this,lang,config);
      std::__cxx11::string::operator=((string *)&cldeps,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::assign((char *)&cudaCompileMode);
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
                (&rule.Name,(char (*) [7])0x695e73,lang,(char (*) [16])0x6dd15e);
      psVar15 = cmMakefile::GetRequiredDefinition(pcVar1,&rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      pbVar22 = (pointer)0x2f512f;
      cmList::assign((cmList *)&cmdVar,psVar15,Yes,No);
      sVar7 = cmdVar._M_string_length;
      for (_Var19 = cmdVar._M_dataplus; _Var19._M_p != (pointer)sVar7;
          _Var19._M_p = _Var19._M_p + 0x20) {
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                  (&rule.Name,&launcher,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p)
        ;
        std::__cxx11::string::operator=((string *)_Var19._M_p,(string *)&rule);
        pbVar22 = (pointer)0x2f5173;
        std::__cxx11::string::~string((string *)&rule);
      }
    }
    else {
      LanguagePreprocessAndScanRule(&rule.Name,this,lang,config);
      std::__cxx11::string::operator=((string *)&cldeps,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::assign((char *)&cudaCompileMode);
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[19]>
                (&rule.Name,(char (*) [7])0x695e73,lang,(char (*) [19])"_PREPROCESS_SOURCE");
      psVar15 = cmMakefile::GetRequiredDefinition(pcVar1,&rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      cmList::assign((cmList *)&cmdVar,psVar15,Yes,No);
      sVar7 = cmdVar._M_string_length;
      for (_Var19 = cmdVar._M_dataplus; sVar9 = tdi._M_string_length,
          _Var8._M_p = tdi._M_dataplus._M_p, this_00 = cmakeCmd._M_string_length,
          _Var19._M_p != (pointer)sVar7; _Var19._M_p = _Var19._M_p + 0x20) {
        cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
                  (&rule.Name,&launcher,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var19._M_p)
        ;
        std::__cxx11::string::operator=((string *)_Var19._M_p,(string *)&rule);
        std::__cxx11::string::~string((string *)&rule);
      }
      cmakeCmd_00._M_len._1_7_ = cmakeCmd._M_dataplus._M_p._1_7_;
      cmakeCmd_00._M_len._0_1_ = cmakeCmd._M_dataplus._M_p._0_1_;
      pcVar5 = (lang->_M_dataplus)._M_p;
      sVar6 = lang->_M_string_length;
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
      optional<const_char_(&)[4],_true>
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &local_48._M_value,(char (*) [4])0x6ba6a1);
      lang_00._M_str = pcVar5;
      lang_00._M_len = sVar6;
      srcFile._M_str = "$out";
      srcFile._M_len = 4;
      ddiFile._M_str = "$DYNDEP_INTERMEDIATE_FILE";
      ddiFile._M_len = 0x19;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = local_48._M_value._M_str;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = local_48._M_value._M_len;
      srcOrigFile.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           local_38;
      cmakeCmd_00._M_str = (char *)sVar9;
      tdi_00._M_str = pcVar20;
      tdi_00._M_len = (size_t)_Var8._M_p;
      (anonymous_namespace)::GetScanCommand_abi_cxx11_
                (&rule.Name,(_anonymous_namespace_ *)this_00,cmakeCmd_00,tdi_00,lang_00,srcFile,
                 ddiFile,srcOrigFile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdVar,
                 &rule.Name);
      pbVar22 = (pointer)0x2f5275;
      std::__cxx11::string::~string((string *)&rule);
    }
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)cmdVar._M_dataplus._M_p;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)cmdVar._M_string_length;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmdVar.field_2._M_allocated_capacity;
    cmdVar._M_dataplus._M_p = (pointer)0x0;
    cmdVar._M_string_length = 0;
    cmdVar.field_2._M_allocated_capacity = 0;
    psVar15 = &responseFlag;
    scanCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = config;
    scanCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_238;
    scanCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar22;
    anon_unknown.dwarf_d13043::GetScanRule
              (&rule,&cldeps,&cudaCompileMode,psVar14,&local_1a0,psVar15,&flags,local_550,
               this->LocalGenerator,scanCmds,(string *)CONCAT17(cVar10,in_stack_fffffffffffffa18));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
    cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[15]>
              (&depfileFlags,(char (*) [21])"Rule for generating ",lang,(char (*) [15])0x6910e1);
    std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&depfileFlags);
    std::__cxx11::string::~string((string *)&depfileFlags);
    if (cVar10 == '\0') {
      cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[14]>
                (&depfileFlags,(char (*) [18])"Scanning $in for ",lang,(char (*) [14])0x6b4f7d);
    }
    else {
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[19]>
                (&depfileFlags,(char (*) [10])"Building ",lang,(char (*) [19])" preprocessed $out");
    }
    std::__cxx11::string::operator=((string *)&rule.Description,(string *)&depfileFlags);
    std::__cxx11::string::~string((string *)&depfileFlags);
    pcVar16 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar16,&rule);
    cmNinjaRule::~cmNinjaRule(&rule);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    std::__cxx11::string::~string((string *)&cldeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmdVar);
    if (cVar10 != '\0') {
      bVar11 = CompileWithDefines(this,lang);
      if (!bVar11) {
        local_1a0.Defines = "";
      }
      LanguageScanRule(&cldeps,this,lang,config);
      cmdVar._M_dataplus._M_p = (pointer)0x0;
      cmdVar._M_string_length = 0;
      cmdVar.field_2._M_allocated_capacity = 0;
      cmakeCmd_01._M_len._1_7_ = cmakeCmd._M_dataplus._M_p._1_7_;
      cmakeCmd_01._M_len._0_1_ = cmakeCmd._M_dataplus._M_p._0_1_;
      local_208 = 0;
      lang_01._M_str = (lang->_M_dataplus)._M_p;
      lang_01._M_len = lang->_M_string_length;
      srcFile_00._M_str = "$in";
      srcFile_00._M_len = 3;
      ddiFile_00._M_str = "$out";
      ddiFile_00._M_len = 4;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_str = (char *)uStack_210;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._M_value._M_len = local_218;
      srcOrigFile_00.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._16_8_ =
           (ulong)uStack_207 << 8;
      cmakeCmd_01._M_str = (char *)tdi._M_string_length;
      tdi_01._M_str = (char *)psVar15;
      tdi_01._M_len = (size_t)tdi._M_dataplus._M_p;
      (anonymous_namespace)::GetScanCommand_abi_cxx11_
                (&rule.Name,(_anonymous_namespace_ *)cmakeCmd._M_string_length,cmakeCmd_01,tdi_01,
                 lang_01,srcFile_00,ddiFile_00,srcOrigFile_00);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdVar,
                 &rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cudaCompileMode,"",(allocator<char> *)&defName);
      pbVar22 = (pointer)0x2f5565;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&depfileFlags,"",(allocator<char> *)&local_4e0);
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)cmdVar._M_dataplus._M_p;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)cmdVar._M_string_length;
      local_258.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)cmdVar.field_2._M_allocated_capacity;
      cmdVar._M_dataplus._M_p = (pointer)0x0;
      cmdVar._M_string_length = 0;
      cmdVar.field_2._M_allocated_capacity = 0;
      scanCmds_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = config;
      scanCmds_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_258;
      scanCmds_00.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar22;
      anon_unknown.dwarf_d13043::GetScanRule
                (&rule,&cldeps,&cudaCompileMode,psVar14,&local_1a0,&depfileFlags,&flags,local_550,
                 this->LocalGenerator,scanCmds_00,
                 (string *)CONCAT17(cVar10,in_stack_fffffffffffffa18));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_258);
      std::__cxx11::string::~string((string *)&depfileFlags);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
      cmStrCat<char_const(&)[21],std::__cxx11::string_const&,char_const(&)[41]>
                (&cudaCompileMode,(char (*) [21])"Rule for generating ",lang,
                 (char (*) [41])" dependencies on non-preprocessed files.");
      std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&cudaCompileMode);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
      cmStrCat<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[22]>
                (&cudaCompileMode,(char (*) [12])"Generating ",lang,
                 (char (*) [22])" dependencies for $in");
      std::__cxx11::string::operator=((string *)&rule.Description,(string *)&cudaCompileMode);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
      pcVar16 = GetGlobalGenerator(this);
      cmGlobalNinjaGenerator::AddRule(pcVar16,&rule);
      cmNinjaRule::~cmNinjaRule(&rule);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cmdVar);
      std::__cxx11::string::~string((string *)&cldeps);
    }
    LanguageDyndepRule(&local_1c0,this,lang,config);
    cmNinjaRule::cmNinjaRule(&rule,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::assign((char *)&rule.RspFile);
    std::__cxx11::string::assign((char *)&rule.RspContent);
    std::__cxx11::string::assign((char *)&rule.Restat);
    cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
    cldeps._M_string_length = 0;
    cldeps.field_2._M_local_buf[0] = '\0';
    if (modmapFormat._M_string_length != 0) {
      cmStrCat<char_const(&)[14],std::__cxx11::string_const&>
                (&cudaCompileMode,(char (*) [14])" --modmapfmt=",&modmapFormat);
      std::__cxx11::string::append((string *)&cldeps);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
    }
    cmdVar._M_dataplus._M_p = (pointer)0x0;
    cmdVar._M_string_length = 0;
    cmdVar.field_2._M_allocated_capacity = 0;
    cmStrCat<std::__cxx11::string_const&,char_const(&)[30],std::__cxx11::string_const&,char_const(&)[9],std::__cxx11::string_const&,std::__cxx11::string&,char_const(&)[13],std::__cxx11::string&>
              (&cudaCompileMode,&cmakeCmd,(char (*) [30])" -E cmake_ninja_dyndep --tdi=",&tdi,
               (char (*) [9])0x6b9771,lang,&cldeps,(char (*) [13])" --dd=$out @",&rule.RspFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdVar,
               &cudaCompileMode);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    depfileFlags._M_dataplus._M_p = (pointer)&depfileFlags.field_2;
    depfileFlags._M_string_length = 0;
    depfileFlags.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&cudaCompileMode,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cmdVar,config,config,&depfileFlags,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&rule.Command,(string *)&cudaCompileMode);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    std::__cxx11::string::~string((string *)&depfileFlags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmdVar);
    depfileFlags._M_dataplus._M_p._0_1_ = 0x2e;
    cmStrCat<char_const(&)[41],std::__cxx11::string_const&,char>
              (&cudaCompileMode,(char (*) [41])"Rule to generate ninja dyndep files for ",lang,
               (char *)&depfileFlags);
    std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&cudaCompileMode);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    cmStrCat<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[18]>
              (&cudaCompileMode,(char (*) [12])"Generating ",lang,(char (*) [18])" dyndep file $out"
              );
    std::__cxx11::string::operator=((string *)&rule.Description,(string *)&cudaCompileMode);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    pcVar16 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar16,&rule);
    std::__cxx11::string::~string((string *)&cldeps);
    cmNinjaRule::~cmNinjaRule(&rule);
  }
  LanguageCompilerRule(&local_1e0,this,lang,config,withScanning);
  cmNinjaRule::cmNinjaRule(&rule,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (responseFlag._M_string_length != 0) {
    std::__cxx11::string::assign((char *)&rule.RspFile);
    cudaCompileMode._M_dataplus._M_p._0_1_ = 0x20;
    depfileFlags._M_dataplus._M_p._0_1_ = 0x20;
    cmdVar._M_dataplus._M_p._0_1_ = 0x20;
    cmStrCat<char,char_const*&,char,char_const*&,char,std::__cxx11::string&>
              (&cldeps,(char *)&cudaCompileMode,&local_1a0.Defines,(char *)&depfileFlags,
               &local_1a0.Includes,(char *)&cmdVar,&flags);
    psVar14 = &rule.RspContent;
    std::__cxx11::string::operator=((string *)psVar14,(string *)&cldeps);
    std::__cxx11::string::~string((string *)&cldeps);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&cldeps,&responseFlag,&rule.RspFile);
    std::__cxx11::string::operator=((string *)&flags,(string *)&cldeps);
    std::__cxx11::string::~string((string *)&cldeps);
    local_1a0.Defines = "";
    local_1a0.Includes = "";
    bVar11 = std::operator==(lang,"Swift");
    if (bVar11) {
      cudaCompileMode._M_dataplus._M_p._0_1_ = 0x20;
      cmStrCat<std::__cxx11::string&,char,char_const*&>
                (&cldeps,psVar14,(char *)&cudaCompileMode,&local_1a0.Source);
      std::__cxx11::string::operator=((string *)psVar14,(string *)&cldeps);
      std::__cxx11::string::~string((string *)&cldeps);
      local_1a0.Source = "";
    }
  }
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  cldeps.field_2._M_local_buf[0] = '\0';
  if (cVar10 == '\0') {
    cmStrCat<char_const(&)[22],std::__cxx11::string_const&>
              (&cudaCompileMode,(char (*) [22])"CMAKE_NINJA_CMCLDEPS_",lang);
    bVar11 = cmMakefile::IsOn(pcVar1,&cudaCompileMode);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
    if (bVar11) {
      bVar11 = cmMakefile::GetIsSourceFileTryCompile(pcVar1);
      if (bVar11) goto LAB_002f5df2;
      std::__cxx11::string::assign((char *)&rule.DepType);
      std::__cxx11::string::assign((char *)&rule.DepFile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cudaCompileMode,"CMAKE_C_COMPILER",(allocator<char> *)&depfileFlags);
      cVar17 = cmMakefile::GetDefinition(pcVar1,&cudaCompileMode);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
      cVar18 = cVar17;
      if (cVar17.Value == (string *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&depfileFlags,"CMAKE_CXX_COMPILER",&local_571);
        cVar18.Value = cmMakefile::GetSafeDefinition(pcVar1,&depfileFlags);
      }
      std::__cxx11::string::string((string *)&cudaCompileMode,(string *)cVar18.Value);
      if (cVar17.Value == (string *)0x0) {
        std::__cxx11::string::~string((string *)&depfileFlags);
      }
      cmdVar._M_dataplus._M_p = (pointer)&cmdVar.field_2;
      cmdVar._M_string_length = 0;
      cmdVar.field_2._M_allocated_capacity =
           cmdVar.field_2._M_allocated_capacity & 0xffffffffffffff00;
      psVar14 = cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
      cmsys::SystemTools::GetShortPath(psVar14,&cmdVar);
      compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(compileCmds.Values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
      local_5b1 = ' ';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_572);
      psVar14 = cmMakefile::GetSafeDefinition(pcVar1,&local_4e0);
      cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&,char,char_const*&,char_const(&)[18],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[3]>
                (&defName,&cmdVar,(char *)&compileCmds,lang,&local_5b1,&local_1a0.Source,
                 (char (*) [18])" $DEP_FILE $out \"",psVar14,(char (*) [4])0x6e34f7,&cudaCompileMode
                 ,(char (*) [3])0x6e2ebd);
      std::__cxx11::string::operator=((string *)&cldeps,(string *)&defName);
      std::__cxx11::string::~string((string *)&defName);
      std::__cxx11::string::~string((string *)&local_4e0);
      psVar14 = &cmdVar;
    }
    else {
      pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
                (&cudaCompileMode,(char (*) [7])0x695e73,lang,(char (*) [16])0x6ba5cb);
      psVar14 = cmMakefile::GetSafeDefinition(pcVar4,&cudaCompileMode);
      std::__cxx11::string::~string((string *)&cudaCompileMode);
      __y._M_str = "msvc";
      __y._M_len = 4;
      __x._M_str = (psVar14->_M_dataplus)._M_p;
      __x._M_len = psVar14->_M_string_length;
      bVar11 = std::operator==(__x,__y);
      if (bVar11) {
        std::__cxx11::string::assign((char *)&rule.DepType);
        rule.DepFile._M_string_length = 0;
        *rule.DepFile._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::assign((char *)&rule.DepType);
        std::__cxx11::string::assign((char *)&rule.DepFile);
      }
      local_1a0.DependencyFile = rule.DepFile._M_dataplus._M_p;
      local_1a0.DependencyTarget = "$out";
      cmStrCat<char_const(&)[21],std::__cxx11::string_const&>
                (&cudaCompileMode,(char (*) [21])"CMAKE_DEPFILE_FLAGS_",lang);
      psVar14 = cmMakefile::GetSafeDefinition(pcVar1,&cudaCompileMode);
      std::__cxx11::string::string((string *)&depfileFlags,(string *)psVar14);
      if (depfileFlags._M_string_length != 0) {
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_550,(cmOutputConverter *)this->LocalGenerator,&depfileFlags,&local_1a0);
        defName._M_dataplus._M_p._0_1_ = 0x20;
        cmStrCat<char,std::__cxx11::string&>(&cmdVar,(char *)&defName,&depfileFlags);
        std::__cxx11::string::append((string *)&flags);
        std::__cxx11::string::~string((string *)&cmdVar);
      }
      psVar14 = &depfileFlags;
    }
    std::__cxx11::string::~string((string *)psVar14);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
  }
LAB_002f5df2:
  if ((withScanning == Yes) && (modmapFormat._M_string_length != 0)) {
    cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[17]>
              (&cmdVar,(char (*) [7])0x695e73,lang,(char (*) [17])"_MODULE_MAP_FLAG");
    psVar14 = cmMakefile::GetRequiredDefinition(pcVar1,&cmdVar);
    std::__cxx11::string::string((string *)&cudaCompileMode,(string *)psVar14);
    std::__cxx11::string::~string((string *)&cmdVar);
    cmsys::SystemTools::ReplaceString
              (&cudaCompileMode,"<MODULE_MAP_FILE>","$DYNDEP_MODULE_MAP_FILE");
    defName._M_dataplus._M_p._0_1_ = 0x20;
    cmStrCat<char,std::__cxx11::string&>(&cmdVar,(char *)&defName,&cudaCompileMode);
    std::__cxx11::string::append((string *)&flags);
    std::__cxx11::string::~string((string *)&cmdVar);
    std::__cxx11::string::~string((string *)&cudaCompileMode);
  }
  local_1a0.Flags = flags._M_dataplus._M_p;
  local_1a0.DependencyFile = rule.DepFile._M_dataplus._M_p;
  cudaCompileMode._M_dataplus._M_p = (pointer)&cudaCompileMode.field_2;
  cudaCompileMode._M_string_length = 0;
  cudaCompileMode.field_2._M_local_buf[0] = '\0';
  bVar11 = std::operator==(lang,"CUDA");
  if (bVar11) {
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmdVar,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&defName);
    bVar11 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&cmdVar);
    std::__cxx11::string::~string((string *)&cmdVar);
    if (bVar11) {
      pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmdVar,"_CMAKE_CUDA_RDC_FLAG",(allocator<char> *)&defName);
      psVar14 = cmMakefile::GetRequiredDefinition(pcVar4,&cmdVar);
      std::__cxx11::string::~string((string *)&cmdVar);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2]>
                (&cmdVar,&cudaCompileMode,psVar14,(char (*) [2])0x6b87c8);
      std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&cmdVar);
      std::__cxx11::string::~string((string *)&cmdVar);
    }
    if ((WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
         ::compileModes == '\0') &&
       (iVar13 = __cxa_guard_acquire(&WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                                      ::compileModes), iVar13 != 0)) {
      WriteCompileRule::compileModes._M_elems[0]._M_len = 3;
      WriteCompileRule::compileModes._M_elems[0]._M_str = "PTX";
      WriteCompileRule::compileModes._M_elems[1]._M_len = 5;
      WriteCompileRule::compileModes._M_elems[1]._M_str = "CUBIN";
      WriteCompileRule::compileModes._M_elems[2]._M_len = 6;
      WriteCompileRule::compileModes._M_elems[2]._M_str = "FATBIN";
      WriteCompileRule::compileModes._M_elems[3]._M_len = 5;
      WriteCompileRule::compileModes._M_elems[3]._M_str = "OPTIX";
      __cxa_guard_release(&WriteCompileRule(std::__cxx11::string_const&,std::__cxx11::string_const&,cmNinjaTargetGenerator::WithScanning)
                           ::compileModes);
    }
    bVar11 = true;
    lVar21 = 0;
    do {
      if (lVar21 == 0x40) break;
      compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)((long)&WriteCompileRule::compileModes._M_elems[0]._M_len + lVar21);
      compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)((long)&WriteCompileRule::compileModes._M_elems[0]._M_str + lVar21);
      cmStrCat<char_const(&)[6],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[13]>
                (&cmdVar,(char (*) [6])0x6ba7fe,
                 (basic_string_view<char,_std::char_traits<char>_> *)&compileCmds,
                 (char (*) [13])0x69a0ea);
      cmStrCat<char_const(&)[13],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[6]>
                (&defName,(char (*) [13])"_CMAKE_CUDA_",
                 (basic_string_view<char,_std::char_traits<char>_> *)&compileCmds,
                 (char (*) [6])0x6ba7e1);
      bVar12 = cmGeneratorTarget::GetPropertyAsBool
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cmdVar);
      if (bVar12) {
        psVar14 = cmMakefile::GetRequiredDefinition
                            ((this->super_cmCommonTargetGenerator).Makefile,&defName);
        cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>
                  (&local_4e0,&cudaCompileMode,psVar14);
        std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        bVar11 = false;
      }
      std::__cxx11::string::~string((string *)&defName);
      std::__cxx11::string::~string((string *)&cmdVar);
      lVar21 = lVar21 + 0x10;
    } while (!bVar12);
    if (bVar11) {
      pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmdVar,"_CMAKE_CUDA_WHOLE_FLAG",(allocator<char> *)&defName);
      psVar14 = cmMakefile::GetRequiredDefinition(pcVar4,&cmdVar);
      std::__cxx11::string::~string((string *)&cmdVar);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&>(&cmdVar,&cudaCompileMode,psVar14);
      std::__cxx11::string::operator=((string *)&cudaCompileMode,(string *)&cmdVar);
      std::__cxx11::string::~string((string *)&cmdVar);
    }
    local_1a0.CudaCompileMode = cudaCompileMode._M_dataplus._M_p;
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16]>
            (&cmdVar,(char (*) [7])0x695e73,lang,(char (*) [16])0x6bab90);
  psVar14 = cmMakefile::GetRequiredDefinition(pcVar1,&cmdVar);
  cmList::cmList(&compileCmds,psVar14,Yes,No);
  if (compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::insert
              ((ulong)compileCmds.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(char *)0x0);
    std::__cxx11::string::insert
              ((ulong)compileCmds.Values.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(char *)0x0);
    if (compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        compileCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::insert
                ((ulong)compileCmds.Values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
    }
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
            (&defName,(char (*) [7])0x695e73,lang,(char (*) [24])"_DEPENDS_EXTRA_COMMANDS");
  psVar14 = cmMakefile::GetSafeDefinition(pcVar1,&defName);
  std::__cxx11::string::~string((string *)&defName);
  if (psVar14->_M_string_length != 0) {
    cmList::append(&compileCmds,psVar14,Yes,No);
  }
  pbVar22 = compileCmds.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (b = compileCmds.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; b != pbVar22; b = b + 1) {
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&defName,&launcher,b);
    std::__cxx11::string::operator=((string *)b,(string *)&defName);
    std::__cxx11::string::~string((string *)&defName);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (local_550,(cmOutputConverter *)this->LocalGenerator,b,&local_1a0);
  }
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  local_4e0._M_string_length = 0;
  local_4e0.field_2._M_local_buf[0] = '\0';
  cmLocalNinjaGenerator::BuildCommandLine
            (&defName,this->LocalGenerator,&compileCmds.Values,config,config,&local_4e0,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&defName);
  std::__cxx11::string::~string((string *)&defName);
  std::__cxx11::string::~string((string *)&local_4e0);
  cmStrCat<char_const(&)[20],std::__cxx11::string_const&,char_const(&)[8]>
            (&defName,(char (*) [20])"Rule for compiling ",lang,(char (*) [8])0x6917d3);
  std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&defName);
  std::__cxx11::string::~string((string *)&defName);
  cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[13]>
            (&defName,(char (*) [10])"Building ",lang,(char (*) [13])" object $out");
  std::__cxx11::string::operator=((string *)&rule.Description,(string *)&defName);
  std::__cxx11::string::~string((string *)&defName);
  pcVar16 = GetGlobalGenerator(this);
  cmGlobalNinjaGenerator::AddRule(pcVar16,&rule);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds.Values);
  std::__cxx11::string::~string((string *)&cmdVar);
  std::__cxx11::string::~string((string *)&cudaCompileMode);
  std::__cxx11::string::~string((string *)&cldeps);
  cmNinjaRule::~cmNinjaRule(&rule);
  std::__cxx11::string::~string((string *)&cmakeCmd);
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&tdi);
  if (local_550 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_550->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  std::__cxx11::string::~string((string *)&modmapFormat);
  std::__cxx11::string::~string((string *)&modmapFormatVar);
  std::__cxx11::string::~string((string *)&responseFlag);
  std::__cxx11::string::~string((string *)&flags);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang,
                                              const std::string& config,
                                              WithScanning withScanning)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";
  vars.CudaCompileMode = "$CUDA_COMPILE_MODE";
  vars.ISPCHeader = "$ISPC_HEADER_FILE";

  cmMakefile* mf = this->GetMakefile();

  // For some cases we scan to dynamically discover dependencies.
  bool const compilationPreprocesses = !this->NeedExplicitPreprocessing(lang);

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_FLAG");
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }
  std::string const modmapFormatVar =
    cmStrCat("CMAKE_", lang, "_MODULE_MAP_FORMAT");
  std::string const modmapFormat =
    this->Makefile->GetSafeDefinition(modmapFormatVar);

  auto rulePlaceholderExpander =
    this->GetLocalGenerator()->CreateRulePlaceholderExpander();

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(this->GetTargetDependInfoPath(lang, config)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  std::string val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE", config);
  if (cmNonempty(val)) {
    launcher = cmStrCat(val, ' ');
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (withScanning == WithScanning::Yes) {
    const auto& scanDepType = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_SCANDEP_DEPFILE_FORMAT"));

    // Rule to scan dependencies of sources that need preprocessing.
    {
      cmList scanCommands;
      std::string scanRuleName;
      std::string ppFileName;
      if (compilationPreprocesses) {
        scanRuleName = this->LanguageScanRule(lang, config);
        ppFileName = "$PREPROCESSED_OUTPUT_FILE";
        std::string const& scanCommand = mf->GetRequiredDefinition(
          cmStrCat("CMAKE_", lang, "_SCANDEP_SOURCE"));
        scanCommands.assign(scanCommand);
        for (auto& i : scanCommands) {
          i = cmStrCat(launcher, i);
        }
      } else {
        scanRuleName = this->LanguagePreprocessAndScanRule(lang, config);
        ppFileName = "$out";
        std::string const& ppCommmand = mf->GetRequiredDefinition(
          cmStrCat("CMAKE_", lang, "_PREPROCESS_SOURCE"));
        scanCommands.assign(ppCommmand);
        for (auto& i : scanCommands) {
          i = cmStrCat(launcher, i);
        }
        scanCommands.emplace_back(GetScanCommand(
          cmakeCmd, tdi, lang, "$out", "$DYNDEP_INTERMEDIATE_FILE", "$in"));
      }

      auto scanRule = GetScanRule(
        scanRuleName, ppFileName, scanDepType, vars, responseFlag, flags,
        rulePlaceholderExpander.get(), this->GetLocalGenerator(),
        std::move(scanCommands), config);

      scanRule.Comment =
        cmStrCat("Rule for generating ", lang, " dependencies.");
      if (compilationPreprocesses) {
        scanRule.Description =
          cmStrCat("Scanning $in for ", lang, " dependencies");
      } else {
        scanRule.Description =
          cmStrCat("Building ", lang, " preprocessed $out");
      }

      this->GetGlobalGenerator()->AddRule(scanRule);
    }

    if (!compilationPreprocesses) {
      // Compilation will not preprocess, so it does not need the defines
      // unless the compiler wants them for some other purpose.
      if (!this->CompileWithDefines(lang)) {
        vars.Defines = "";
      }

      // Rule to scan dependencies of sources that do not need preprocessing.
      std::string const& scanRuleName = this->LanguageScanRule(lang, config);
      std::vector<std::string> scanCommands;
      scanCommands.emplace_back(
        GetScanCommand(cmakeCmd, tdi, lang, "$in", "$out"));

      auto scanRule =
        GetScanRule(scanRuleName, "", scanDepType, vars, "", flags,
                    rulePlaceholderExpander.get(), this->GetLocalGenerator(),
                    std::move(scanCommands), config);

      // Write the rule for generating dependencies for the given language.
      scanRule.Comment = cmStrCat("Rule for generating ", lang,
                                  " dependencies on non-preprocessed files.");
      scanRule.Description =
        cmStrCat("Generating ", lang, " dependencies for $in");

      this->GetGlobalGenerator()->AddRule(scanRule);
    }

    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang, config));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";
    // Ninja's collator writes all outputs using `cmGeneratedFileStream`, so
    // they are only updated if contents actually change. Avoid running
    // dependent jobs if the contents don't change by telling `ninja` to check
    // the timestamp again.
    rule.Restat = "1";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    std::string ddModmapArg;
    if (!modmapFormat.empty()) {
      ddModmapArg += cmStrCat(" --modmapfmt=", modmapFormat);
    }
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmStrCat(
          cmakeCmd, " -E cmake_ninja_dyndep --tdi=", tdi, " --lang=", lang,
          ddModmapArg, " --dd=$out @", rule.RspFile);
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command =
        this->GetLocalGenerator()->BuildCommandLine(ddCmds, config, config);
    }
    rule.Comment =
      cmStrCat("Rule to generate ninja dyndep files for ", lang, '.');
    rule.Description = cmStrCat("Generating ", lang, " dyndep file $out");
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang, config, withScanning));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', vars.Defines, ' ', vars.Includes, ' ', flags);
    flags = cmStrCat(responseFlag, rule.RspFile);
    vars.Defines = "";
    vars.Includes = "";

    // Swift consumes all source files in a module at once, which reaches
    // command line length limits pretty quickly. Inject source files into the
    // response file in this case as well.
    if (lang == "Swift") {
      rule.RspContent = cmStrCat(rule.RspContent, ' ', vars.Source);
      vars.Source = "";
    }
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (!compilationPreprocesses) {
    // The compiler will not do preprocessing, so it has no such dependencies.
  } else if (mf->IsOn(cmStrCat("CMAKE_NINJA_CMCLDEPS_", lang))) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      cmValue d = mf->GetDefinition("CMAKE_C_COMPILER");
      const std::string cl =
        d ? *d : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      std::string cmcldepsPath;
      cmSystemTools::GetShortPath(cmSystemTools::GetCMClDepsCommand(),
                                  cmcldepsPath);
      cldeps = cmStrCat(cmcldepsPath, ' ', lang, ' ', vars.Source,
                        " $DEP_FILE $out \"",
                        mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX"),
                        "\" \"", cl, "\" ");
    }
  } else {
    const auto& depType = this->GetMakefile()->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_DEPFILE_FORMAT"));
    if (depType == "msvc"_s) {
      rule.DepType = "msvc";
      rule.DepFile.clear();
    } else {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
    }
    vars.DependencyFile = rule.DepFile.c_str();
    vars.DependencyTarget = "$out";

    const std::string flagsName = cmStrCat("CMAKE_DEPFILE_FLAGS_", lang);
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   depfileFlags, vars);
      flags += cmStrCat(' ', depfileFlags);
    }
  }

  if (withScanning == WithScanning::Yes && !modmapFormat.empty()) {
    std::string modmapFlags =
      mf->GetRequiredDefinition(cmStrCat("CMAKE_", lang, "_MODULE_MAP_FLAG"));
    cmSystemTools::ReplaceString(modmapFlags, "<MODULE_MAP_FILE>",
                                 "$DYNDEP_MODULE_MAP_FILE");
    flags += cmStrCat(' ', modmapFlags);
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  std::string cudaCompileMode;
  if (lang == "CUDA") {
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      const std::string& rdcFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_RDC_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, rdcFlag, " ");
    }
    static std::array<cm::string_view, 4> const compileModes{
      { "PTX"_s, "CUBIN"_s, "FATBIN"_s, "OPTIX"_s }
    };
    bool useNormalCompileMode = true;
    for (cm::string_view mode : compileModes) {
      auto propName = cmStrCat("CUDA_", mode, "_COMPILATION");
      auto defName = cmStrCat("_CMAKE_CUDA_", mode, "_FLAG");
      if (this->GeneratorTarget->GetPropertyAsBool(propName)) {
        const std::string& flag =
          this->Makefile->GetRequiredDefinition(defName);
        cudaCompileMode = cmStrCat(cudaCompileMode, flag);
        useNormalCompileMode = false;
        break;
      }
    }
    if (useNormalCompileMode) {
      const std::string& wholeFlag =
        this->Makefile->GetRequiredDefinition("_CMAKE_CUDA_WHOLE_FLAG");
      cudaCompileMode = cmStrCat(cudaCompileMode, wholeFlag);
    }
    vars.CudaCompileMode = cudaCompileMode.c_str();
  }

  // Rule for compiling object file.
  const std::string cmdVar = cmStrCat("CMAKE_", lang, "_COMPILE_OBJECT");
  const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
  cmList compileCmds(compileCmd);

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, "${CODE_CHECK}");
    compileCmds.front().insert(0, "${LAUNCHER}");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  const auto& extraCommands = this->GetMakefile()->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_DEPENDS_EXTRA_COMMANDS"));
  if (!extraCommands.empty()) {
    compileCmds.append(extraCommands);
  }

  for (auto& i : compileCmds) {
    i = cmStrCat(launcher, i);
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds, config, config);

  // Write the rule for compiling file of the given language.
  rule.Comment = cmStrCat("Rule for compiling ", lang, " files.");
  rule.Description = cmStrCat("Building ", lang, " object $out");
  this->GetGlobalGenerator()->AddRule(rule);
}